

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::CollectMemcopyStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  MemOpList *pMVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  SymID SVar6;
  uint uVar7;
  uint uVar8;
  SymID SVar9;
  undefined4 *puVar10;
  IndirOpnd *pIVar11;
  GlobOpt *baseOpnd;
  StackSym *pSVar12;
  GlobOpt *pGVar13;
  JITTimeFunctionBody *pJVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  Type *ppMVar17;
  MemCopyCandidate *pMVar18;
  char16_t *form;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  SymID local_4c;
  GlobOpt *pGStack_48;
  SymID inductionSymID;
  GlobOpt *local_40;
  SymID local_34;
  
  if ((loop->memOpInfo == (MemOpInfo *)0x0) ||
     (pMVar1 = loop->memOpInfo->candidates,
     (MemOpList *)
     (pMVar1->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
     super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
     super_SListNodeBase<Memory::ArenaAllocator>.next == pMVar1)) {
    return false;
  }
  bVar3 = IR::Opnd::IsIndirOpnd(instr->m_dst);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x81a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_00423619;
    *puVar10 = 0;
  }
  pIVar11 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  local_40 = (GlobOpt *)pIVar11->m_indexOpnd;
  baseOpnd = (GlobOpt *)IR::Opnd::AsRegOpnd(&pIVar11->m_baseOpnd->super_Opnd);
  pGVar13 = baseOpnd;
  pSVar12 = IR::Opnd::GetStackSym((Opnd *)baseOpnd);
  SVar6 = GetVarSymID(pGVar13,pSVar12);
  bVar3 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (!bVar3) {
    return false;
  }
  local_34 = SVar6;
  pGVar13 = (GlobOpt *)IR::Opnd::AsRegOpnd(instr->m_src1);
  if ((*(undefined1 *)((long)((ValueType *)&pGVar13->byteCodeConstantValueNumbersBv + 1) + 1) & 4)
      == 0) {
    if (DAT_0145948a != '\x01') {
      return false;
    }
    uVar7 = Func::GetSourceContextId(this->func);
    uVar8 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar7,uVar8);
    if (!bVar3) {
      uVar7 = Func::GetSourceContextId(this->func);
      uVar8 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar7,uVar8);
      if (!bVar3) {
        return false;
      }
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar14 = Func::GetJITFunctionBody(this->func);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar16 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_a8);
    uVar7 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar7);
    form = L"Source (s%d) is still alive after StElemI";
  }
  else {
    pGStack_48 = this;
    bVar3 = IsAllowedForMemOpt(this,instr,false,(RegOpnd *)baseOpnd,(Opnd *)local_40);
    if (!bVar3) {
      return false;
    }
    pSVar12 = IR::Opnd::GetStackSym((Opnd *)pGVar13);
    SVar6 = GetVarSymID(pGVar13,pSVar12);
    ppMVar17 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                         ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                          loop->memOpInfo->candidates);
    pGVar13 = (GlobOpt *)*ppMVar17;
    if (*(MemOpType *)((long)&pGVar13->byteCodeConstantValueNumbersBv + 4) != MEMCOPY) {
      return false;
    }
    pMVar18 = Loop::MemOpCandidate::AsMemCopy((MemOpCandidate *)pGVar13);
    if (((pMVar18->super_MemOpCandidate).base == 0xffffffff) &&
       (SVar9 = GetVarSymID(pGVar13,pMVar18->transferSym), pGVar13 = local_40, SVar9 == SVar6)) {
      pSVar12 = IR::Opnd::GetStackSym((Opnd *)local_40);
      SVar6 = local_34;
      if (pSVar12 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x847,"(indexOp->GetStackSym())","indexOp->GetStackSym()");
        if (!bVar3) goto LAB_00423619;
        *puVar10 = 0;
        pGVar13 = local_40;
      }
      pSVar12 = IR::Opnd::GetStackSym((Opnd *)pGVar13);
      local_4c = GetVarSymID(pGVar13,pSVar12);
      bVar3 = IsSymIDInductionVariable(pGVar13,local_4c,loop);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x849,"(IsSymIDInductionVariable(inductionSymID, loop))",
                           "IsSymIDInductionVariable(inductionSymID, loop)");
        if (!bVar3) goto LAB_00423619;
        *puVar10 = 0;
      }
      bVar3 = JsUtil::
              BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,&local_4c);
      pGVar13 = pGStack_48;
      bVar3 = (pMVar18->super_MemOpCandidate).bIndexAlreadyChanged == bVar3;
      if (bVar3) {
        bVar4 = (pMVar18->super_MemOpCandidate).count + 1;
        (pMVar18->super_MemOpCandidate).count = bVar4;
        if (1 < bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x854,"(memcopyInfo->count <= 1)","memcopyInfo->count <= 1");
          if (!bVar5) {
LAB_00423619:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar10 = 0;
        }
        (pMVar18->super_MemOpCandidate).base = SVar6;
        return bVar3;
      }
      if (DAT_0145948a != '\x01') {
        return bVar3;
      }
      uVar7 = Func::GetSourceContextId(pGStack_48->func);
      uVar8 = Func::GetLocalFunctionId(pGVar13->func);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar7,uVar8);
      pGVar13 = pGStack_48;
      if (!bVar5) {
        uVar7 = Func::GetSourceContextId(pGStack_48->func);
        local_40 = (GlobOpt *)CONCAT44(local_40._4_4_,uVar7);
        uVar7 = Func::GetLocalFunctionId(pGVar13->func);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,(uint)local_40,uVar7);
        if (!bVar5) {
          return bVar3;
        }
      }
      Output::Print(L"TRACE MemCopy:");
      pGVar13 = pGStack_48;
      pJVar14 = Func::GetJITFunctionBody(pGStack_48->func);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
      pcVar16 = Func::GetDebugNumberSet(pGVar13->func,(wchar (*) [42])local_a8);
      uVar7 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar7);
      Output::Print(L"Index value changed between ldElem and stElem");
      goto LAB_004231ec;
    }
    pGVar13 = pGStack_48;
    if (DAT_0145948a != '\x01') {
      return false;
    }
    uVar7 = Func::GetSourceContextId(pGStack_48->func);
    uVar8 = Func::GetLocalFunctionId(pGVar13->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar7,uVar8);
    if (!bVar3) {
      uVar7 = Func::GetSourceContextId(pGVar13->func);
      uVar8 = Func::GetLocalFunctionId(pGVar13->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar7,uVar8);
      if (!bVar3) {
        return false;
      }
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar14 = Func::GetJITFunctionBody(pGVar13->func);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar16 = Func::GetDebugNumberSet(pGVar13->func,(wchar (*) [42])local_a8);
    uVar7 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar7);
    form = L"No matching LdElem found (s%d)";
  }
  bVar3 = false;
  Output::Print(form,(ulong)local_34);
LAB_004231ec:
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar15 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar15);
  Output::Print(L"\n");
  Output::Flush();
  return bVar3;
}

Assistant:

bool GlobOpt::CollectMemcopyStElementI(IR::Instr *instr, Loop *loop)
{
    if (!loop->memOpInfo || loop->memOpInfo->candidates->Empty())
    {
        // There is no ldElem matching this stElem
        return false;
    }

    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();
    IR::Opnd *indexOp = dst->GetIndexOpnd();
    IR::RegOpnd *baseOp = dst->GetBaseOpnd()->AsRegOpnd();
    SymID baseSymID = GetVarSymID(baseOp->GetStackSym());

    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    IR::RegOpnd* src1 = instr->GetSrc1()->AsRegOpnd();

    if (!src1->GetIsDead())
    {
        // This must be the last use of the register.
        // It will invalidate `var m = a[i]; b[i] = m;` but this is not a very interesting case.
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Source (s%d) is still alive after StElemI"), baseSymID);
        return false;
    }

    if (!IsAllowedForMemOpt(instr, false, baseOp, indexOp))
    {
        return false;
    }

    SymID srcSymID = GetVarSymID(src1->GetStackSym());

    // Prepare the memcopyCandidate entry
    Loop::MemOpCandidate* previousCandidate = loop->memOpInfo->candidates->Head();
    if (!previousCandidate->IsMemCopy())
    {
        return false;
    }
    Loop::MemCopyCandidate* memcopyInfo = previousCandidate->AsMemCopy();

    // The previous candidate has to have been created by the matching ldElem
    if (
        memcopyInfo->base != Js::Constants::InvalidSymID ||
        GetVarSymID(memcopyInfo->transferSym) != srcSymID
    )
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("No matching LdElem found (s%d)"), baseSymID);
        return false;
    }

    Assert(indexOp->GetStackSym());
    SymID inductionSymID = GetVarSymID(indexOp->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);
    if (isIndexPreIncr != memcopyInfo->bIndexAlreadyChanged)
    {
        // The index changed between the load and the store
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Index value changed between ldElem and stElem"));
        return false;
    }

    // Consider: Can we remove the count field?
    memcopyInfo->count++;
    AssertOrFailFast(memcopyInfo->count <= 1);
    memcopyInfo->base = baseSymID;

    return true;
}